

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O2

EC_T_DWORD
DoBusScan(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_SB_STATUS_NTFY_DESC *poStatus,
         EC_T_BOOL bWait,EC_T_BOOL bNtfyActive,EC_T_DWORD dwScanBustimeout)

{
  bool bVar1;
  EC_T_DWORD EVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  EC_T_DWORD *in_stack_ffffffffffffff98;
  EC_T_DWORD dwScanBustimeout_local;
  CAtEmLogging *local_58;
  CEcTimer oTimeout;
  
  dwScanBustimeout_local = dwScanBustimeout;
  CEcTimer::CEcTimer(&oTimeout);
  uVar5 = 0;
  EVar2 = emIoCtl(dwInstanceID,0x50007,&dwScanBustimeout_local,4,(void *)0x0,0,
                  in_stack_ffffffffffffff98);
  if (EVar2 != 0) {
    CAtEmLogging::LogError
              (poLog,"Scan Bus feature could not be enabled! (Result = 0x%x)",(ulong)EVar2);
    return EVar2;
  }
  local_58 = poLog;
  CEcTimer::Start(&oTimeout,dwScanBustimeout_local);
LAB_0014a11e:
  do {
    bVar1 = false;
LAB_0014a120:
    uVar4 = (uint)uVar5;
    iVar3 = CEcTimer::IsElapsed(&oTimeout);
    if (iVar3 != 0 || bVar1) {
LAB_0014a1e0:
      iVar3 = CEcTimer::IsElapsed(&oTimeout);
      if (iVar3 != 0) {
        return 0x98110010;
      }
      return uVar4;
    }
    uVar4 = emIoControl(dwInstanceID,0x50001,0);
    if (uVar4 != 0x98110008) {
      uVar5 = (ulong)uVar4;
      if (uVar4 != 0) {
        CAtEmLogging::LogError(local_58,"DoBusScan(): Error 0x%x when restarting bus scan",uVar5);
        goto LAB_0014a1e0;
      }
      do {
        iVar3 = CEcTimer::IsElapsed(&oTimeout);
        if (iVar3 != 0) goto LAB_0014a11e;
        LinuxSleep(10);
        EVar2 = emIoCtl(dwInstanceID,0x50002,(void *)0x0,0,poStatus,8,in_stack_ffffffffffffff98);
        if (EVar2 != 0) {
          uVar5 = (ulong)EVar2;
          bVar1 = false;
          CAtEmLogging::LogError
                    (local_58,"DoBusScan(): Error 0x%x getting the Bus scan status",(ulong)EVar2);
          goto LAB_0014a120;
        }
        uVar5 = (ulong)poStatus->dwResultCode;
      } while ((bWait != 0) && (0xfffffffd < poStatus->dwResultCode + 0x67eefff7));
      bVar1 = true;
      goto LAB_0014a120;
    }
    LinuxSleep(10);
    uVar5 = 0x98110008;
  } while( true );
}

Assistant:

EC_T_DWORD DoBusScan
    (EC_T_DWORD                dwInstanceID
    ,CAtEmLogging*             poLog
    ,EC_T_SB_STATUS_NTFY_DESC* poStatus           /**< [out]  bus scan status */
    ,EC_T_BOOL                 bWait              /**< [in]   EC_TRUE if call shall block until the scan is finish */
    ,EC_T_BOOL                 bNtfyActive        /**< [in]   EC_TRUE if notifications are active */
    ,EC_T_DWORD                dwScanBustimeout)  /**< [in]   Timeout value in msec */
{
    EC_T_DWORD dwRes = EC_E_NOERROR;
    CEcTimer   oTimeout;
    EC_T_BOOL  bReady = EC_FALSE;

    EC_UNREFPARM(bNtfyActive);

    /* set timeout */
    dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_ENABLE, &dwScanBustimeout, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
    if (EC_E_NOERROR != dwRes)
    {
        LogErr( "Scan Bus feature could not be enabled! (Result = 0x%x)", dwRes);
        goto Exit;
    }

    oTimeout.Start(dwScanBustimeout);
    while (!oTimeout.IsElapsed() && !bReady)
    {
        dwRes = emIoControl(dwInstanceID, EC_IOCTL_SB_RESTART, EC_NULL);
        if (EC_E_BUSY == dwRes)
        {
            OsSleep(10);
        }
        else if (EC_E_NOERROR != dwRes)
        {
            LogErr("DoBusScan(): Error 0x%x when restarting bus scan", dwRes);
            break;
        }
        else
        {
            while (!oTimeout.IsElapsed())
            {
                OsSleep(10);
                dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_STATUS_GET, EC_NULL, 0, poStatus, sizeof(EC_T_SB_STATUS_NTFY_DESC), EC_NULL);
                if (dwRes != EC_E_NOERROR)
                {
                    LogErr("DoBusScan(): Error 0x%x getting the Bus scan status", dwRes);
                    break;
                }
                dwRes = poStatus->dwResultCode;
                if (!bWait || ((dwRes != EC_E_BUSY) && (dwRes != EC_E_NOTREADY)))
                {
                    bReady = EC_TRUE;
                    break;
                }
            }
        }
    }

    if (oTimeout.IsElapsed())
    {
        dwRes = EC_E_TIMEOUT;
    }
Exit:
    return dwRes;
}